

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O1

bool __thiscall RTIMUMPU9250::IMURead(RTIMUMPU9250 *this)

{
  RTIMU_DATA *pRVar1;
  int *piVar2;
  RTFLOAT RVar3;
  RTFLOAT RVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  ushort uVar10;
  uint64_t uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  uchar fifoCount [2];
  uchar fifoData [12];
  uchar compassData [8];
  ushort local_3a;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  
  bVar9 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'r',
                            '\x02',(uchar *)&local_3a,"Failed to read fifo count");
  if (!bVar9) goto LAB_0011d139;
  uVar10 = local_3a << 8 | local_3a >> 8;
  if (uVar10 == 0x200) {
    iVar12 = 0;
    printf("%s","MPU-9250 fifo has overflowed");
    fflush(_stdout);
    resetFifo(this);
    pRVar1 = &(this->super_RTIMU).m_imuData;
    pRVar1->timestamp = pRVar1->timestamp + (this->super_RTIMU).m_sampleInterval * 0x2b;
    goto LAB_0011d13b;
  }
  if (uVar10 - 0xc < 0xb4 && this->m_cacheCount == 0) {
    bVar9 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              't','\f',(uchar *)&local_38,"Failed to read fifo data");
    if ((bVar9) &&
       (bVar9 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_slaveAddr,'I','\b',(uchar *)&local_28,
                                  "Failed to read compass data"), bVar9)) {
LAB_0011d05c:
      RTMath::convertToVector
                ((uchar *)&local_38,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,true);
      RTMath::convertToVector
                ((uchar *)((long)&local_38 + 6),&(this->super_RTIMU).m_imuData.gyro,
                 this->m_gyroScale,true);
      RTMath::convertToVector
                ((uchar *)((long)&local_28 + 1),&(this->super_RTIMU).m_imuData.compass,0.6,false);
      RVar3 = (this->super_RTIMU).m_imuData.gyro.m_data[2];
      RVar4 = (this->super_RTIMU).m_imuData.accel.m_data[0];
      (this->super_RTIMU).m_imuData.gyro.m_data[1] = -(this->super_RTIMU).m_imuData.gyro.m_data[1];
      (this->super_RTIMU).m_imuData.gyro.m_data[2] = -RVar3;
      (this->super_RTIMU).m_imuData.accel.m_data[0] = -RVar4;
      fVar5 = (this->super_RTIMU).m_imuData.compass.m_data[0];
      fVar6 = this->m_compassAdjust[0];
      fVar7 = (this->super_RTIMU).m_imuData.compass.m_data[1];
      fVar8 = this->m_compassAdjust[1];
      (this->super_RTIMU).m_imuData.compass.m_data[2] =
           (this->super_RTIMU).m_imuData.compass.m_data[2] * this->m_compassAdjust[2];
      (this->super_RTIMU).m_imuData.compass.m_data[0] = fVar7 * fVar8;
      (this->super_RTIMU).m_imuData.compass.m_data[1] = -(fVar5 * fVar6);
      RTIMU::handleGyroBias(&this->super_RTIMU);
      RTIMU::calibrateAverageCompass(&this->super_RTIMU);
      RTIMU::calibrateAccel(&this->super_RTIMU);
      if (this->m_firstTime == true) {
        uVar11 = RTMath::currentUSecsSinceEpoch();
      }
      else {
        uVar11 = (this->super_RTIMU).m_imuData.timestamp + (this->super_RTIMU).m_sampleInterval;
      }
      (this->super_RTIMU).m_imuData.timestamp = uVar11;
      this->m_firstTime = false;
      RTIMU::updateFusion(&this->super_RTIMU);
      iVar12 = 1;
      goto LAB_0011d13b;
    }
  }
  else {
    if (0xbf < uVar10) {
      if (this->m_cacheCount == 0x10) {
        iVar12 = this->m_cacheOut;
        pRVar1 = &(this->super_RTIMU).m_imuData;
        pRVar1->timestamp =
             pRVar1->timestamp +
             (long)this->m_cache[iVar12].count * (this->super_RTIMU).m_sampleInterval;
        iVar12 = iVar12 + 1;
        iVar14 = 0;
        if (iVar12 != 0x10) {
          iVar14 = iVar12;
        }
        this->m_cacheOut = iVar14;
        this->m_cacheCount = 0xf;
      }
      uVar16 = 0x10;
      if (uVar10 / 0xc < 0x10) {
        uVar16 = uVar10 / 0xc;
      }
      bVar9 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                                't',(char)uVar16 * '\f',this->m_cache[this->m_cacheIn].data,
                                "Failed to read fifo data");
      if (!bVar9) goto LAB_0011d139;
      bVar9 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                                'I','\b',this->m_cache[this->m_cacheIn].compass,
                                "Failed to read compass data");
      iVar12 = 0;
      if (!bVar9) goto LAB_0011d13b;
      iVar14 = this->m_cacheIn;
      this->m_cache[iVar14].count = uVar16;
      this->m_cache[iVar14].index = 0;
      this->m_cacheCount = this->m_cacheCount + 1;
      if (iVar14 + 1 != 0x10) {
        iVar12 = iVar14 + 1;
      }
      this->m_cacheIn = iVar12;
    }
    iVar12 = this->m_cacheCount;
    if (iVar12 != 0) {
      iVar14 = this->m_cacheOut;
      lVar15 = (long)this->m_cache[iVar14].index;
      local_30 = *(undefined4 *)(this->m_cache[iVar14].data + lVar15 + 8);
      local_38 = *(undefined8 *)(this->m_cache[iVar14].data + lVar15);
      local_28 = *(undefined8 *)this->m_cache[iVar14].compass;
      piVar2 = &this->m_cache[iVar14].index;
      *piVar2 = *piVar2 + 0xc;
      piVar2 = &this->m_cache[iVar14].count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        iVar13 = 0;
        if (iVar14 + 1 != 0x10) {
          iVar13 = iVar14 + 1;
        }
        this->m_cacheOut = iVar13;
        this->m_cacheCount = iVar12 + -1;
      }
      goto LAB_0011d05c;
    }
  }
LAB_0011d139:
  iVar12 = 0;
LAB_0011d13b:
  return SUB41(iVar12,0);
}

Assistant:

bool RTIMUMPU9250::IMURead()
{
    unsigned char fifoCount[2];
    unsigned int count;
    unsigned char fifoData[12];
    unsigned char compassData[8];

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_COUNT_H, 2, fifoCount, "Failed to read fifo count"))
         return false;

    count = ((unsigned int)fifoCount[0] << 8) + fifoCount[1];

    if (count == 512) {
        HAL_INFO("MPU-9250 fifo has overflowed");
        resetFifo();
        m_imuData.timestamp += m_sampleInterval * (512 / MPU9250_FIFO_CHUNK_SIZE + 1); // try to fix timestamp
        return false;
    }

#ifdef MPU9250_CACHE_MODE
    if ((m_cacheCount == 0) && (count  >= MPU9250_FIFO_CHUNK_SIZE) && (count < (MPU9250_CACHE_SIZE * MPU9250_FIFO_CHUNK_SIZE))) {
        // special case of a small fifo and nothing cached - just handle as simple read

        if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
            return false;

        if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, compassData, "Failed to read compass data"))
            return false;
    } else {
        if (count >= (MPU9250_CACHE_SIZE * MPU9250_FIFO_CHUNK_SIZE)) {
            if (m_cacheCount == MPU9250_CACHE_BLOCK_COUNT) {
                // all cache blocks are full - discard oldest and update timestamp to account for lost samples
                m_imuData.timestamp += m_sampleInterval * m_cache[m_cacheOut].count;
                if (++m_cacheOut == MPU9250_CACHE_BLOCK_COUNT)
                    m_cacheOut = 0;
                m_cacheCount--;
            }

            int blockCount = count / MPU9250_FIFO_CHUNK_SIZE;   // number of chunks in fifo

            if (blockCount > MPU9250_CACHE_SIZE)
                blockCount = MPU9250_CACHE_SIZE;

            if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE * blockCount,
                    m_cache[m_cacheIn].data, "Failed to read fifo data"))
                return false;

            if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, m_cache[m_cacheIn].compass, "Failed to read compass data"))
                return false;

            m_cache[m_cacheIn].count = blockCount;
            m_cache[m_cacheIn].index = 0;

            m_cacheCount++;
            if (++m_cacheIn == MPU9250_CACHE_BLOCK_COUNT)
                m_cacheIn = 0;

        }

        //  now fifo has been read if necessary, get something to process

        if (m_cacheCount == 0)
            return false;

        memcpy(fifoData, m_cache[m_cacheOut].data + m_cache[m_cacheOut].index, MPU9250_FIFO_CHUNK_SIZE);
        memcpy(compassData, m_cache[m_cacheOut].compass, 8);

        m_cache[m_cacheOut].index += MPU9250_FIFO_CHUNK_SIZE;

        if (--m_cache[m_cacheOut].count == 0) {
            //  this cache block is now empty

            if (++m_cacheOut == MPU9250_CACHE_BLOCK_COUNT)
                m_cacheOut = 0;
            m_cacheCount--;
        }
    }

#else

    if (count > MPU9250_FIFO_CHUNK_SIZE * 40) {
        // more than 40 samples behind - going too slowly so discard some samples but maintain timestamp correctly
        while (count >= MPU9250_FIFO_CHUNK_SIZE * 10) {
            if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
                return false;
            count -= MPU9250_FIFO_CHUNK_SIZE;
            m_imuData.timestamp += m_sampleInterval;
        }
    }

    if (count < MPU9250_FIFO_CHUNK_SIZE)
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_FIFO_R_W, MPU9250_FIFO_CHUNK_SIZE, fifoData, "Failed to read fifo data"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_EXT_SENS_DATA_00, 8, compassData, "Failed to read compass data"))
        return false;

#endif

    RTMath::convertToVector(fifoData, m_imuData.accel, m_accelScale, true);
    RTMath::convertToVector(fifoData + 6, m_imuData.gyro, m_gyroScale, true);
    RTMath::convertToVector(compassData + 1, m_imuData.compass, 0.6f, false);

    //  sort out gyro axes

    m_imuData.gyro.setX(m_imuData.gyro.x());
    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel data;

    m_imuData.accel.setX(-m_imuData.accel.x());

    //  use the compass fuse data adjustments

    m_imuData.compass.setX(m_imuData.compass.x() * m_compassAdjust[0]);
    m_imuData.compass.setY(m_imuData.compass.y() * m_compassAdjust[1]);
    m_imuData.compass.setZ(m_imuData.compass.z() * m_compassAdjust[2]);

    //  sort out compass axes

    float temp;

    temp = m_imuData.compass.x();
    m_imuData.compass.setX(m_imuData.compass.y());
    m_imuData.compass.setY(-temp);

    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    if (m_firstTime)
        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    else
        m_imuData.timestamp += m_sampleInterval;

    m_firstTime = false;

    //  now update the filter

    updateFusion();

    return true;
}